

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O2

void uo_cb_invoke(uo_cb *cb)

{
  uo_cb_func_linklist *link;
  uo_linklist *puVar1;
  uo_linklist *puVar2;
  uo_cb_func UNRECOVERED_JUMPTABLE;
  
  link = (uo_cb_func_linklist *)(cb->funclist).next;
  if (link != (uo_cb_func_linklist *)&cb->funclist) {
    puVar1 = (link->link).next;
    puVar2 = (link->link).prev;
    puVar1->prev = puVar2;
    puVar2->next = puVar1;
    (link->link).next = (uo_linklist *)0x0;
    (link->link).prev = (uo_linklist *)0x0;
    UNRECOVERED_JUMPTABLE = link->item;
    uo_cb_func_linkpool_return(link);
    (*UNRECOVERED_JUMPTABLE)(cb);
    return;
  }
  uo_cb_destroy(cb);
  return;
}

Assistant:

void uo_cb_invoke(
    uo_cb *cb)
{
    if (!uo_linklist_is_empty(&cb->funclist))
    {
        uo_cb_func_linklist *cb_func_linklist = (uo_cb_func_linklist *)uo_linklist_next(&cb->funclist);
        uo_linklist_unlink(cb_func_linklist);
        uo_cb_func cb_func = cb_func_linklist->item;
        uo_cb_func_linkpool_return(cb_func_linklist);
        cb_func(cb);
    }
    else
        uo_cb_destroy(cb);
}